

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

Script * cfd::core::ScriptUtil::CreateP2wshLockingScript
                   (Script *__return_storage_ptr__,Script *redeem_script)

{
  ByteData256 script_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  HashUtil::Sha256((ByteData256 *)&_Stack_28,redeem_script);
  CreateP2wshLockingScript(__return_storage_ptr__,(ByteData256 *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreateP2wshLockingScript(const Script& redeem_script) {
  // create script hash
  ByteData256 script_hash = HashUtil::Sha256(redeem_script);

  return CreateP2wshLockingScript(script_hash);
}